

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O2

Int128 * helper_atomic_cmpxchgo_be_mmu_tricore
                   (Int128 *__return_storage_ptr__,CPUArchState_conflict30 *env,
                   target_ulong_conflict addr,Int128 cmpv,Int128 newv,TCGMemOpIdx oi,
                   uintptr_t retaddr)

{
  undefined1 cmp [16];
  undefined1 new [16];
  undefined8 in_RAX;
  Int128 *__return_storage_ptr___00;
  uint in_register_0000000c;
  ulong extraout_RDX;
  undefined8 unaff_RBX;
  undefined8 unaff_R12;
  undefined8 unaff_R14;
  
  __return_storage_ptr___00 =
       (Int128 *)
       atomic_mmu_lookup((CPUArchState_conflict30 *)__return_storage_ptr__,
                         (target_ulong_conflict)env,(TCGMemOpIdx)cmpv,cmpv._8_8_);
  cmp._8_8_ = unaff_RBX;
  cmp._0_8_ = in_RAX;
  new._8_8_ = unaff_R14;
  new._0_8_ = unaff_R12;
  atomic16_cmpxchg(__return_storage_ptr___00,
                   (Int128 *)
                   ((ulong)(in_register_0000000c >> 0x18) |
                    (((ulong)in_register_0000000c & 0xff0000) << 0x20) >> 0x28 |
                    (((ulong)in_register_0000000c & 0xff00) << 0x20) >> 0x18 |
                    (((ulong)in_register_0000000c & 0xff) << 0x20) >> 8 |
                    ((ulong)oi & 0xff000000) << 8 | ((ulong)oi & 0xff0000) << 0x18 |
                    ((ulong)oi & 0xff00) << 0x28 | CONCAT44(in_register_0000000c,oi) << 0x38),
                   (Int128)cmp,(Int128)new);
  return (Int128 *)
         (extraout_RDX >> 0x38 | (extraout_RDX & 0xff000000000000) >> 0x28 |
          (extraout_RDX & 0xff0000000000) >> 0x18 | (extraout_RDX & 0xff00000000) >> 8 |
          (extraout_RDX & 0xff000000) << 8 | (extraout_RDX & 0xff0000) << 0x18 |
          (extraout_RDX & 0xff00) << 0x28 | extraout_RDX << 0x38);
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;
#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, BSWAP(cmpv), BSWAP(newv));
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, BSWAP(cmpv), BSWAP(newv));
#else
    ret = atomic_cmpxchg__nocheck(haddr, BSWAP(cmpv), BSWAP(newv));
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return BSWAP(ret);
}